

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O0

positionTy * __thiscall positionTy::deg2rad(positionTy *this)

{
  double *pdVar1;
  positionTy *in_RSI;
  positionTy *in_RDI;
  double dVar2;
  
  memcpy(in_RDI,in_RSI,0x48);
  if ((SUB21(in_RSI->f,1) >> 3 & 1) == 0) {
    dVar2 = lat(in_RSI);
    dVar2 = ::deg2rad(dVar2);
    pdVar1 = lat(in_RDI);
    *pdVar1 = dVar2;
    dVar2 = lon(in_RSI);
    dVar2 = ::deg2rad(dVar2);
    pdVar1 = lon(in_RDI);
    *pdVar1 = dVar2;
    in_RDI->f = (posFlagsTy)((ushort)in_RDI->f & 0xf7ff | 0x800);
  }
  return in_RDI;
}

Assistant:

positionTy positionTy::deg2rad() const
{
    positionTy ret(*this);                  // copy position
    if (f.unitAngle == UNIT_DEG) {          // if DEG convert to RAD
        ret.lat() = ::deg2rad(lat());
        ret.lon() = ::deg2rad(lon());
        ret.f.unitAngle = UNIT_RAD;
    }
    return ret;
}